

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinSerializer<std::__cxx11::list<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>,_void>
     ::serialize<OutputStream>
               (list<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *s,
               OutputStream *ostream)

{
  const_iterator __end0;
  _List_node_base *p_Var1;
  undefined4 local_1c;
  
  local_1c = (undefined4)
             (s->super__List_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>).
             _M_impl._M_node._M_size;
  std::ostream::write((char *)(ostream->stream + 0x10),(long)&local_1c);
  for (p_Var1 = (s->super__List_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                )._M_impl._M_node.super__List_node_base._M_next; p_Var1 != (_List_node_base *)s;
      p_Var1 = (((_List_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *)
                &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    BuiltinSerializer<std::tuple<char,int>,void>::serialize_elems<OutputStream,0ul,1ul>
              (p_Var1 + 1,ostream);
  }
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }